

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_shift(sexp ctx,sexp a,sexp_uint_t k)

{
  ulong uVar1;
  sexp psVar2;
  ulong uVar3;
  
  uVar3 = (a->value).string.offset;
  do {
    uVar1 = uVar3;
    if (uVar1 == 1) break;
    uVar3 = uVar1 - 1;
  } while (*(long *)((long)&a->value + uVar1 * 8 + 8) == 0);
  psVar2 = sexp_make_bignum(ctx,k + uVar1 + 1);
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      *(undefined8 *)((long)&psVar2->value + uVar3 * 8 + k * 8 + 0x10) =
           *(undefined8 *)((long)&a->value + uVar3 * 8 + 0x10);
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
  }
  return psVar2;
}

Assistant:

static sexp sexp_bignum_shift (sexp ctx, sexp a, sexp_uint_t k) {
  sexp res;
  sexp_uint_t alen = sexp_bignum_hi(a), i;
  res = sexp_make_bignum(ctx, alen + k + 1);
  for (i=0; i<alen; i++)
    sexp_bignum_data(res)[i+k] = sexp_bignum_data(a)[i];
  return res;
}